

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

void BindReference(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeCall *pPVar4;
  undefined4 *puVar5;
  ParseNodeName *pPVar6;
  Symbol *pSVar7;
  bool forReference;
  
  OVar1 = pnode->nop;
  if (OVar1 < knopDot) {
    if ((OVar1 != knopTypeof) && (OVar1 != knopDelete)) {
      if (OVar1 != knopCall) {
LAB_00834c67:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x8de,"(0)","Unexpected opcode in BindReference");
        if (bVar3) {
          *puVar5 = 0;
          return;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      pPVar4 = ParseNode::AsParseNodeCall(pnode);
      forReference = true;
      bVar3 = true;
      goto LAB_00834cc4;
    }
    pPVar4 = (ParseNodeCall *)ParseNode::AsParseNodeUni(pnode);
    bVar3 = true;
  }
  else {
    if (OVar1 == knopDot) {
LAB_00834c58:
      bVar3 = false;
    }
    else {
      if (OVar1 != knopAsg) {
        if (OVar1 != knopIndex) goto LAB_00834c67;
        goto LAB_00834c58;
      }
      bVar3 = true;
    }
    pPVar4 = (ParseNodeCall *)ParseNode::AsParseNodeBin(pnode);
  }
  forReference = false;
LAB_00834cc4:
  if (pPVar4->pnodeTarget->nop == knopName) {
    pPVar6 = ParseNode::AsParseNodeName(pPVar4->pnodeTarget);
    pSVar7 = ByteCodeGenerator::FindSymbol
                       (byteCodeGenerator,pPVar6->symRef,pPVar6->pid,forReference);
    pPVar6->sym = pSVar7;
    if (((!bVar3 && pSVar7 != (Symbol *)0x0) && (pSVar7->symbolType == STFunction)) &&
       (((pSVar7->field_0x42 & 8) == 0 || ((byteCodeGenerator->flags & 0x400) != 0)))) {
      ByteCodeGenerator::FuncEscapes(byteCodeGenerator,pSVar7->scope);
      return;
    }
  }
  return;
}

Assistant:

void BindReference(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    // Do special reference-op binding so that we can, for instance, handle call from inside "with"
    // where the "this" instance must be found dynamically.

    bool isCallNode = false;
    bool funcEscapes = false;
    switch (pnode->nop)
    {
    case knopCall:
        isCallNode = true;
        pnode = pnode->AsParseNodeCall()->pnodeTarget;
        break;
    case knopDelete:
    case knopTypeof:
        pnode = pnode->AsParseNodeUni()->pnode1;
        break;
    case knopDot:
    case knopIndex:
        funcEscapes = true;
        // fall through
    case knopAsg:
        pnode = pnode->AsParseNodeBin()->pnode1;
        break;
    default:
        AssertMsg(0, "Unexpected opcode in BindReference");
        return;
    }

    if (pnode->nop == knopName)
    {
        ParseNodeName * pnodeName = pnode->AsParseNodeName();
        pnodeName->sym = byteCodeGenerator->FindSymbol(pnodeName->GetSymRef(), pnodeName->pid, isCallNode);

        if (funcEscapes &&
            pnodeName->sym &&
            pnodeName->sym->GetSymbolType() == STFunction &&
            (!pnodeName->sym->GetIsGlobal() || (byteCodeGenerator->GetFlags() & fscrEval)))
        {
            // Dot, index, and scope ops can cause a local function on the LHS to escape.
            // Make sure scopes are not cached in this case.
            byteCodeGenerator->FuncEscapes(pnodeName->sym->GetScope());
        }
    }
}